

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setStyle(QWidget *this,QStyle *style)

{
  QWidgetPrivate *this_00;
  long lVar1;
  QStyleSheetStyle *this_01;
  bool propagate;
  QWidgetPrivate *d;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  if ((style != (QStyle *)0x0) != (bool)((byte)(this_00->high_attributes[1] >> 0x16) & 1)) {
    this_00->high_attributes[1] =
         (uint)(style != (QStyle *)0x0) << 0x16 | this_00->high_attributes[1] & 0xffbfffff;
  }
  QWidgetPrivate::createExtra(this_00);
  lVar1 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  if (lVar1 != 0) {
    *(int *)(lVar1 + 0x18) = *(int *)(lVar1 + 0x18) + 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QWidgetPrivate::setStyle_helper(this_00,style,false);
      return;
    }
    goto LAB_002fdf90;
  }
  lVar1 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  if (lVar1 == 0) {
    QApplication::styleSheet(&local_38,QCoreApplication::self);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_38.d.size != 0) goto LAB_002fdf44;
    propagate = false;
  }
  else {
LAB_002fdf44:
    this_01 = (QStyleSheetStyle *)operator_new(0x60);
    QStyleSheetStyle::QStyleSheetStyle(this_01,style);
    propagate = true;
    style = (QStyle *)this_01;
  }
  QWidgetPrivate::setStyle_helper(this_00,style,propagate);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_002fdf90:
  __stack_chk_fail();
}

Assistant:

void QWidget::setStyle(QStyle *style)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_SetStyle, style != nullptr);
    d->createExtra();
#ifndef QT_NO_STYLE_STYLESHEET
    if (QStyleSheetStyle *styleSheetStyle = qt_styleSheet(style)) {
        //if for some reason someone try to set a QStyleSheetStyle, ref it
        //(this may happen for example in QButtonDialogBox which propagates its style)
        styleSheetStyle->ref();
        d->setStyle_helper(style, false);
    } else if (qt_styleSheet(d->extra->style) || !qApp->styleSheet().isEmpty()) {
        // if we have an application stylesheet or have a proxy already, propagate
        d->setStyle_helper(new QStyleSheetStyle(style), true);
    } else
#endif
        d->setStyle_helper(style, false);
}